

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O1

void Assimp::IFC::ProcessPolyLine(IfcPolyline *def,TempMesh *meshout,ConversionData *param_3)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  undefined8 *puVar3;
  iterator __position;
  iterator __position_00;
  IfcCartesianPoint *in;
  undefined8 *puVar4;
  IfcVector3 t;
  uint local_3c;
  IfcVector3 local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  puVar4 = *(undefined8 **)&(def->super_IfcBoundedCurve).field_0x50;
  puVar3 = *(undefined8 **)&def->field_0x58;
  if (puVar4 != puVar3) {
    do {
      in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>((LazyObject *)*puVar4);
      ConvertCartesianPoint(&local_38,in);
      __position._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>const&>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                   __position,&local_38);
      }
      else {
        (__position._M_current)->z = local_38.z;
        (__position._M_current)->x = local_38.x;
        (__position._M_current)->y = local_38.y;
        ppaVar1 = &(meshout->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar3);
  }
  local_3c = (int)((ulong)((long)(meshout->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(meshout->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  __position_00._M_current =
       (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&meshout->mVertcnt,__position_00,&local_3c);
  }
  else {
    *__position_00._M_current = local_3c;
    ppuVar2 = &(meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  return;
}

Assistant:

void ProcessPolyLine(const Schema_2x3::IfcPolyline& def, TempMesh& meshout, ConversionData& /*conv*/)
{
    // this won't produce a valid mesh, it just spits out a list of vertices
    IfcVector3 t;
    for(const Schema_2x3::IfcCartesianPoint& cp : def.Points) {
        ConvertCartesianPoint(t,cp);
        meshout.mVerts.push_back(t);
    }
    meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
}